

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O1

void __thiscall Polymer::Move(Polymer *this,int pol_index)

{
  string *psVar1;
  MobileElementManager *this_00;
  element_type *peVar2;
  element_type *peVar3;
  pointer pIVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  SpeciesTracker *pSVar8;
  Interval<std::shared_ptr<BindingSite>,_unsigned_long> *interval;
  pointer pIVar9;
  Ptr pol;
  Ptr transcript;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  intervalVector local_78;
  pointer local_58;
  Ptr local_50;
  Ptr local_40;
  
  this_00 = &this->polymerases_;
  MobileElementManager::GetPol((MobileElementManager *)&local_88,(int)this_00);
  peVar3 = local_88;
  local_58 = (pointer)(long)local_88->start_;
  iVar7 = local_88->stop_;
  (*(code *)(((((shared_ptr<MobileElement> *)&local_88->_vptr_MobileElement)->
              super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_enable_shared_from_this<MobileElement>)._M_weak_this.
            super___weak_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)(local_88)
  ;
  bVar5 = CheckPolCollisions(this,pol_index);
  if (bVar5) {
    (*(code *)(((((shared_ptr<MobileElement> *)&peVar3->_vptr_MobileElement)->
                super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->name_).
              _M_dataplus._M_p)(peVar3);
  }
  else {
    if (peVar3->polymerasereadthrough_ == true) {
      local_40.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
      local_40.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_80;
      if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_80->_M_use_count = local_80->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_80->_M_use_count = local_80->_M_use_count + 1;
        }
      }
      bVar5 = CheckReadthroughPolCollisions(this,&local_40);
      if (local_40.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (bVar5) {
        (*(code *)(((((shared_ptr<MobileElement> *)&local_88->_vptr_MobileElement)->
                    super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->name_).
                  _M_dataplus._M_p)();
        if (bVar5) goto LAB_001190eb;
      }
    }
    local_50.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_88;
    local_50.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_80;
    if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_80->_M_use_count = local_80->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_80->_M_use_count = local_80->_M_use_count + 1;
      }
    }
    bVar5 = CheckMaskCollisions(this,&local_50);
    if (local_50.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (bVar5) {
      (*(code *)(((((shared_ptr<MobileElement> *)&local_88->_vptr_MobileElement)->
                  super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->name_).
                _M_dataplus._M_p)(local_88);
    }
    else {
      psVar1 = &local_88->name_;
      iVar6 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar6 == 0) {
        pSVar8 = SpeciesTracker::Instance();
        if ((pSVar8->codon_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          MobileElementManager::DecrementtRNA(this_00,iVar7);
        }
      }
      CheckBehind(this,(int)local_58,local_88->start_);
      iVar6 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar6 == 0) {
        CheckAheadRnase(this,iVar7,local_88->stop_);
      }
      else {
        CheckAhead(this,iVar7,local_88->stop_);
      }
      bVar5 = CheckTermination(this,pol_index);
      if (bVar5) {
        iVar7 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar7 != 0) {
          local_78.
          super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_78.
          super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_78.
          super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findOverlapping
                    (&this->binding_sites_,(unsigned_long)local_58,(long)local_88->stop_,&local_78);
          pIVar4 = local_78.
                   super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pIVar9 = local_78.
                        super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; pIVar9 != pIVar4;
              pIVar9 = pIVar9 + 1) {
            peVar2 = (pIVar9->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar7 = (peVar2->super_FixedElement).covered_;
            if (0 < iVar7) {
              (peVar2->super_FixedElement).covered_ = iVar7 + -1;
            }
            if ((0 < (peVar2->super_FixedElement).old_covered_) &&
               ((peVar2->super_FixedElement).covered_ == 0)) {
              LogUncover(this,&(peVar2->super_FixedElement).name_);
            }
            peVar2 = (pIVar9->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            (peVar2->super_FixedElement).old_covered_ = (peVar2->super_FixedElement).covered_;
          }
          std::
          vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          ::~vector(&local_78);
          goto LAB_001190eb;
        }
      }
      MobileElementManager::GetAttached((MobileElementManager *)&local_78,(int)this_00);
      if (local_78.
          super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (*((_func_int **)
          (local_78.
           super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->start)[2])();
      }
      iVar7 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar7 == 0) {
        MobileElementManager::UpdatePropensity(this_00,pol_index);
      }
      if (local_78.
          super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.
                   super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
  }
LAB_001190eb:
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  return;
}

Assistant:

void Polymer::Move(int pol_index) {
  auto pol = polymerases_.GetPol(pol_index); 

  // Record old positions
  int old_start = pol->start();
  int old_stop = pol->stop();

  // Move polymerase
  pol->Move();

  // Check for upstream polymerase collision
  bool pol_collision = CheckPolCollisions(pol_index);
  if (pol_collision) {
    //pol->MoveBack();
    pol->MoveBack();
    return;
  }

  // Check for collisions with polymerases at the start of the genome,
  // if simulating readthrough on a circular plasmid
  if (pol->polymerasereadthrough()) {
    bool readthrough_collision = CheckReadthroughPolCollisions(pol);
    if (readthrough_collision) {
      pol->MoveBack();
      return;
    }
  }

  // Check for collisions with mask
  bool mask_collision = CheckMaskCollisions(pol);
  if (mask_collision) {
    //pol->MoveBack();
    pol->MoveBack();
    return;
  }

  // Choose a tRNA to consume, if pol is a ribosome AND 
  // the simulation is using tRNAs
  if (pol->name() == "__ribosome" && !SpeciesTracker::Instance().codon_map().empty()) {
    polymerases_.DecrementtRNA(old_stop);
  }

  // Check for new covered and uncovered elements
  CheckBehind(old_start, pol->start());
  if (pol->name() == "__rnase") {
    CheckAheadRnase(old_stop, pol->stop());
  } else {
    CheckAhead(old_stop, pol->stop());
  }
  
  // Check if polymerase has run into a terminator
  bool terminating = CheckTermination(pol_index);
  if (terminating && pol->name() != "__rnase") {
    std::vector<Interval<BindingSite::Ptr>> results;
    binding_sites_.findOverlapping(old_start, pol->stop(), results);
    for (auto &interval : results) {
      interval.value->Uncover();
      if (interval.value->WasUncovered()) {
        // Record changes that species was covered
        LogUncover(interval.value->name());
      }
      interval.value->ResetState();
    }
    return;
  }

  auto transcript = polymerases_.GetAttached(pol_index);
  if (transcript != nullptr) {
    transcript->ShiftMask();
  }

  // Update propensity for new codon (TODO: make its own function)
  if (pol->name() == "__ribosome") {
    polymerases_.UpdatePropensity(pol_index);
  }
}